

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

cmValue __thiscall cmState::GetGlobalProperty(cmState *this,string *prop)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  cmValue cVar3;
  Mode mode_00;
  char *pcVar4;
  string *psVar5;
  undefined1 *puVar6;
  string_view separator;
  string_view separator_00;
  string_view separator_01;
  string mode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string local_78;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  iVar2 = std::__cxx11::string::compare((char *)prop);
  if (iVar2 == 0) {
    cmCacheManager::GetCacheEntryKeys_abi_cxx11_
              (&local_38,
               (this->CacheManager)._M_t.
               super___uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_>._M_t.
               super__Tuple_impl<0UL,_cmCacheManager_*,_std::default_delete<cmCacheManager>_>.
               super__Head_base<0UL,_cmCacheManager_*,_false>._M_head_impl);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CACHE_VARIABLES","");
    separator._M_str = ";";
    separator._M_len = 1;
    cmJoin(&local_58,&local_38,separator,(string_view)ZEXT816(0));
    cmPropertyMap::SetProperty(&this->GlobalProperties,&local_78,local_58._M_dataplus._M_p);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)prop);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)prop);
      if (iVar2 == 0) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"IN_TRY_COMPILE","");
        pcVar4 = "0";
        if (this->StateProjectKind == TryCompile) {
          pcVar4 = "1";
        }
        cmPropertyMap::SetProperty(&this->GlobalProperties,&local_78,pcVar4);
LAB_002cef98:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_002cefae;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)prop);
        if (iVar2 == 0) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"GENERATOR_IS_MULTI_CONFIG","");
          pcVar4 = "0";
          if (this->IsGeneratorMultiConfig != false) {
            pcVar4 = "1";
          }
          cmPropertyMap::SetProperty(&this->GlobalProperties,&local_78,pcVar4);
          goto LAB_002cef98;
        }
        iVar2 = std::__cxx11::string::compare((char *)prop);
        if (iVar2 == 0) {
          local_78._M_string_length = 0;
          local_78.field_2._M_local_buf[0] = '\0';
          separator_01._M_str = ";";
          separator_01._M_len = 1;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          cmJoin(&local_58,&this->EnabledLanguages,separator_01,(string_view)ZEXT816(0));
          std::__cxx11::string::operator=((string *)&local_78,(string *)&local_58);
          paVar1 = &local_58.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          local_58._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"ENABLED_LANGUAGES","");
          cmPropertyMap::SetProperty(&this->GlobalProperties,&local_58,local_78._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_002cefae;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)prop);
          if (iVar2 != 0) goto LAB_002cefae;
          ModeToString_abi_cxx11_(&local_78,(cmState *)(ulong)this->StateMode,mode_00);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_ROLE","");
          cmPropertyMap::SetProperty(&this->GlobalProperties,&local_58,local_78._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_002cefae;
        }
      }
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
      goto LAB_002cefae;
    }
    GetCommandNames_abi_cxx11_(&local_38,this);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"COMMANDS","");
    separator_00._M_str = ";";
    separator_00._M_len = 1;
    cmJoin(&local_58,&local_38,separator_00,(string_view)ZEXT816(0));
    cmPropertyMap::SetProperty(&this->GlobalProperties,&local_78,local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
LAB_002cefae:
  iVar2 = std::__cxx11::string::compare((char *)prop);
  if (iVar2 == 0) {
    if (GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ != '\0') {
      return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
    }
    iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_);
    if (iVar2 == 0) {
      return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
    }
    GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_.field_2;
    psVar5 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
               "c_std_90;c_std_99;c_std_11;c_std_17;c_std_23;c_function_prototypes;c_restrict;c_variadic_macros;c_static_assert"
               ,"");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,&__dso_handle);
    puVar6 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)prop);
    if (iVar2 == 0) {
      if (GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ != '\0') {
        return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
      }
      iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_)
      ;
      if (iVar2 == 0) {
        return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
      }
      GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_.field_2;
      psVar5 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                 "c_function_prototypes","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,&__dso_handle);
      puVar6 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)prop);
      if (iVar2 == 0) {
        if (GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ != '\0') {
          return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
        }
        iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                     s_out_abi_cxx11_);
        if (iVar2 == 0) {
          return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
        }
        GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_._M_dataplus._M_p =
             (pointer)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_.field_2;
        psVar5 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                   "c_restrict;c_variadic_macros","");
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,&__dso_handle
                    );
        puVar6 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)prop);
        if (iVar2 == 0) {
          if (GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ != '\0') {
            return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
          }
          iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                       s_out_abi_cxx11_);
          if (iVar2 == 0) {
            return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
          }
          GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_._M_dataplus._M_p =
               (pointer)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_.field_2;
          psVar5 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                     "c_static_assert","");
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                       &__dso_handle);
          puVar6 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)prop);
          if (iVar2 == 0) {
            if (GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ != '\0') {
              return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
            }
            iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                         s_out_abi_cxx11_);
            if (iVar2 == 0) {
              return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
            }
            GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_._M_dataplus._M_p =
                 (pointer)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_.field_2;
            psVar5 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                       "cxx_std_98;cxx_std_11;cxx_std_14;cxx_std_17;cxx_std_20;cxx_std_23;cxx_std_26;cxx_template_template_parameters;cxx_alias_templates;cxx_alignas;cxx_alignof;cxx_attributes;cxx_auto_type;cxx_constexpr;cxx_decltype;cxx_decltype_incomplete_return_types;cxx_default_function_template_args;cxx_defaulted_functions;cxx_defaulted_move_initializers;cxx_delegating_constructors;cxx_deleted_functions;cxx_enum_forward_declarations;cxx_explicit_conversions;cxx_extended_friend_declarations;cxx_extern_templates;cxx_final;cxx_func_identifier;cxx_generalized_initializers;cxx_inheriting_constructors;cxx_inline_namespaces;cxx_lambdas;cxx_local_type_template_args;cxx_long_long_type;cxx_noexcept;cxx_nonstatic_member_init;cxx_nullptr;cxx_override;cxx_range_for;cxx_raw_string_literals;cxx_reference_qualified_functions;cxx_right_angle_brackets;cxx_rvalue_references;cxx_sizeof_member;cxx_static_assert;cxx_strong_enums;cxx_thread_local;cxx_trailing_return_types;cxx_unicode_literals;cxx_uniform_initialization;cxx_unrestricted_unions;cxx_user_literals;cxx_variadic_macros;cxx_variadic_templates;cxx_aggregate_default_initializers;cxx_attribute_deprecated;cxx_binary_literals;cxx_contextual_conversions;cxx_decltype_auto;cxx_digit_separators;cxx_generic_lambdas;cxx_lambda_init_captures;cxx_relaxed_constexpr;cxx_return_type_deduction;cxx_variable_templates"
                       ,"");
            __cxa_atexit(std::__cxx11::string::~string,
                         &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                         &__dso_handle);
            puVar6 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)prop);
            if (iVar2 == 0) {
              if (GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ != '\0') {
                return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
              }
              iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                           s_out_abi_cxx11_);
              if (iVar2 == 0) {
                return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
              }
              GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_._M_dataplus._M_p =
                   (pointer)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_.
                             field_2;
              psVar5 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_
                         ,"cxx_template_template_parameters","");
              __cxa_atexit(std::__cxx11::string::~string,
                           &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                           &__dso_handle);
              puVar6 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)prop);
              if (iVar2 == 0) {
                if (GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ != '\0') {
                  return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
                }
                iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                             s_out_abi_cxx11_);
                if (iVar2 == 0) {
                  return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
                }
                GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_._M_dataplus._M_p =
                     (pointer)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_.
                               field_2;
                psVar5 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)
                           &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                           "cxx_alias_templates;cxx_alignas;cxx_alignof;cxx_attributes;cxx_auto_type;cxx_constexpr;cxx_decltype;cxx_decltype_incomplete_return_types;cxx_default_function_template_args;cxx_defaulted_functions;cxx_defaulted_move_initializers;cxx_delegating_constructors;cxx_deleted_functions;cxx_enum_forward_declarations;cxx_explicit_conversions;cxx_extended_friend_declarations;cxx_extern_templates;cxx_final;cxx_func_identifier;cxx_generalized_initializers;cxx_inheriting_constructors;cxx_inline_namespaces;cxx_lambdas;cxx_local_type_template_args;cxx_long_long_type;cxx_noexcept;cxx_nonstatic_member_init;cxx_nullptr;cxx_override;cxx_range_for;cxx_raw_string_literals;cxx_reference_qualified_functions;cxx_right_angle_brackets;cxx_rvalue_references;cxx_sizeof_member;cxx_static_assert;cxx_strong_enums;cxx_thread_local;cxx_trailing_return_types;cxx_unicode_literals;cxx_uniform_initialization;cxx_unrestricted_unions;cxx_user_literals;cxx_variadic_macros;cxx_variadic_templates"
                           ,"");
                __cxa_atexit(std::__cxx11::string::~string,
                             &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                             &__dso_handle);
                puVar6 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)prop);
                if (iVar2 == 0) {
                  if (GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ != '\0') {
                    return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::
                                     s_out_abi_cxx11_;
                  }
                  iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                               s_out_abi_cxx11_);
                  if (iVar2 == 0) {
                    return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::
                                     s_out_abi_cxx11_;
                  }
                  GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_._M_dataplus._M_p
                       = (pointer)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_.
                                   field_2;
                  psVar5 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)
                             &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                             "cxx_aggregate_default_initializers;cxx_attribute_deprecated;cxx_binary_literals;cxx_contextual_conversions;cxx_decltype_auto;cxx_digit_separators;cxx_generic_lambdas;cxx_lambda_init_captures;cxx_relaxed_constexpr;cxx_return_type_deduction;cxx_variable_templates"
                             ,"");
                  __cxa_atexit(std::__cxx11::string::~string,
                               &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                               &__dso_handle);
                  puVar6 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)prop);
                  if (iVar2 != 0) {
                    cVar3 = cmPropertyMap::GetPropertyValue(&this->GlobalProperties,prop);
                    return (cmValue)cVar3.Value;
                  }
                  if (GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ != '\0') {
                    return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::
                                     s_out_abi_cxx11_;
                  }
                  iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                               s_out_abi_cxx11_);
                  if (iVar2 == 0) {
                    return (cmValue)&GetGlobalProperty(std::__cxx11::string_const&)::
                                     s_out_abi_cxx11_;
                  }
                  GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_._M_dataplus._M_p
                       = (pointer)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_.
                                   field_2;
                  psVar5 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)
                             &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                             "cuda_std_03;cuda_std_11;cuda_std_14;cuda_std_17;cuda_std_20;cuda_std_23;cuda_std_26"
                             ,"");
                  __cxa_atexit(std::__cxx11::string::~string,
                               &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                               &__dso_handle);
                  puVar6 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
                }
              }
            }
          }
        }
      }
    }
  }
  __cxa_guard_release(puVar6);
  return (cmValue)psVar5;
}

Assistant:

cmValue cmState::GetGlobalProperty(const std::string& prop)
{
  if (prop == "CACHE_VARIABLES") {
    std::vector<std::string> cacheKeys = this->GetCacheEntryKeys();
    this->SetGlobalProperty("CACHE_VARIABLES", cmJoin(cacheKeys, ";").c_str());
  } else if (prop == "COMMANDS") {
    std::vector<std::string> commands = this->GetCommandNames();
    this->SetGlobalProperty("COMMANDS", cmJoin(commands, ";").c_str());
  } else if (prop == "IN_TRY_COMPILE") {
    this->SetGlobalProperty(
      "IN_TRY_COMPILE",
      this->StateProjectKind == ProjectKind::TryCompile ? "1" : "0");
  } else if (prop == "GENERATOR_IS_MULTI_CONFIG") {
    this->SetGlobalProperty("GENERATOR_IS_MULTI_CONFIG",
                            this->IsGeneratorMultiConfig ? "1" : "0");
  } else if (prop == "ENABLED_LANGUAGES") {
    std::string langs;
    langs = cmJoin(this->EnabledLanguages, ";");
    this->SetGlobalProperty("ENABLED_LANGUAGES", langs.c_str());
  } else if (prop == "CMAKE_ROLE") {
    std::string mode = this->GetModeString();
    this->SetGlobalProperty("CMAKE_ROLE", mode.c_str());
  }
#define STRING_LIST_ELEMENT(F) ";" #F
  if (prop == "CMAKE_C_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_C_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_C90_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_C90_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_C99_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_C99_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_C11_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_C11_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_CXX_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_CXX_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_CXX98_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_CXX98_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_CXX11_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_CXX11_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_CXX14_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_CXX14_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_CUDA_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_CUDA_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }

#undef STRING_LIST_ELEMENT
  return this->GlobalProperties.GetPropertyValue(prop);
}